

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

char * __thiscall google::protobuf::internal::LongSooRep::elements(LongSooRep *this)

{
  char **v1;
  void **v2;
  LogMessage *pLVar1;
  undefined1 auVar2 [16];
  LogMessageFatal local_40 [23];
  Voidify local_29;
  void *local_28;
  string *local_20;
  string *absl_log_internal_check_op_result;
  char *ret;
  LongSooRep *this_local;
  
  absl_log_internal_check_op_result = (string *)(this->elements_int & 0xfffffffffffffff8);
  ret = (char *)this;
  v1 = absl::lts_20240722::log_internal::GetReferenceableValue<char*>
                 ((char **)&absl_log_internal_check_op_result);
  local_28 = (void *)0x0;
  v2 = absl::lts_20240722::log_internal::GetReferenceableValue<decltype(nullptr)>(&local_28);
  local_20 = absl::lts_20240722::log_internal::Check_NEImpl<char*,decltype(nullptr)>
                       (v1,v2,"ret != nullptr");
  if (local_20 != (string *)0x0) {
    auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_20);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0x98,auVar2._0_8_,auVar2._8_8_);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_40);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_29,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
  }
  return (char *)absl_log_internal_check_op_result;
}

Assistant:

char* elements() const {
    auto ret = reinterpret_cast<char*>(elements_int & kSooPtrMask);
    ABSL_DCHECK_NE(ret, nullptr);
    return ret;
  }